

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_record.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  char *format;
  int iVar15;
  int iVar16;
  undefined4 uVar17;
  float in_XMM1_Da;
  undefined4 uVar18;
  float fVar19;
  int local_cc;
  ALLEGRO_PATH *tmp_path;
  ulong local_b0;
  long local_a8;
  long local_a0;
  float local_98;
  float local_94;
  long local_90;
  long local_88;
  undefined8 local_80;
  ALLEGRO_EVENT e;
  
  tmp_path = (ALLEGRO_PATH *)0x0;
  cVar3 = al_install_system(0x85020700,atexit);
  if (cVar3 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    cVar3 = al_init_primitives_addon();
    if (cVar3 == '\0') {
      format = "Unable to initialize primitives addon";
    }
    else {
      cVar3 = al_install_keyboard();
      if (cVar3 == '\0') {
        format = "Unable to install keyboard";
      }
      else {
        cVar3 = al_install_audio();
        if (cVar3 == '\0') {
          format = "Unable to initialize audio addon";
        }
        else {
          cVar3 = al_init_acodec_addon();
          if (cVar3 == '\0') {
            format = "Unable to initialize acodec addon";
          }
          else {
            local_90 = al_create_audio_recorder(1000,0x500,0x5622,8,0x10);
            if (local_90 == 0) {
              format = "Unable to create audio recorder";
            }
            else {
              lVar7 = al_create_audio_stream(4,0x1000,0x5622,8,0x10);
              if (lVar7 == 0) {
                format = "Unable to create audio stream";
              }
              else {
                local_b0 = 0;
                al_reserve_samples(0);
                al_set_audio_stream_playing(lVar7,0);
                uVar8 = al_get_default_mixer();
                al_attach_audio_stream_to_mixer(lVar7,uVar8);
                uVar8 = al_create_event_queue();
                al_set_new_display_option(0x11,1,2);
                al_set_new_display_option(0x12,8,2);
                lVar9 = al_create_display(0x140,0x100);
                if (lVar9 != 0) {
                  al_set_window_title(lVar9,"SPACE to record. P to playback.");
                  lVar11 = local_90;
                  uVar10 = al_get_audio_recorder_event_source(local_90);
                  al_register_event_source(uVar8,uVar10);
                  uVar10 = al_get_audio_stream_event_source(lVar7);
                  al_register_event_source(uVar8,uVar10);
                  uVar10 = al_get_display_event_source(lVar9);
                  al_register_event_source(uVar8,uVar10);
                  uVar10 = al_get_keyboard_event_source();
                  al_register_event_source(uVar8,uVar10);
                  al_start_audio_recorder(lVar11);
                  bVar2 = false;
                  local_cc = 0;
                  lVar9 = 0;
                  local_88 = lVar7;
                  local_80 = uVar8;
LAB_00102703:
                  al_wait_for_event(uVar8,&e);
                  if (e.type == 0xb) {
                    if (e.display.height == 0x20) {
                      if (!bVar2) {
                        cVar3 = al_get_audio_stream_playing(lVar7);
                        if (cVar3 != '\0') {
                          al_drain_audio_stream(lVar7);
                        }
                        if (tmp_path == (ALLEGRO_PATH *)0x0) {
                          lVar9 = al_make_temp_file("alrecXXX.raw",&tmp_path);
                        }
                        else {
                          if (lVar9 != 0) {
                            al_fclose(lVar9);
                          }
                          uVar10 = al_path_cstr(tmp_path,0x2f);
                          lVar9 = al_fopen(uVar10,"w");
                        }
                        bVar2 = true;
                        local_b0 = 0;
                        goto LAB_00102703;
                      }
                      if (lVar9 != 0) {
                        al_fclose(lVar9);
                      }
                      bVar2 = false;
                    }
                    else {
                      if (e.display.height != 0x70) {
                        if (e.display.height == 0x1b) goto LAB_00102b0f;
                        goto LAB_00102703;
                      }
                      if (tmp_path == (ALLEGRO_PATH *)0x0 || bVar2) goto LAB_00102703;
                      uVar10 = al_path_cstr(tmp_path,0x2f);
                      lVar9 = al_fopen(uVar10,"r");
                      if (lVar9 != 0) {
                        al_set_audio_stream_playing(lVar7,1);
                        goto LAB_00102703;
                      }
                    }
                  }
                  else {
                    if (e.type != 0x201) {
                      if (e.type == 0x203) {
                        local_a8 = lVar9;
                        lVar11 = al_get_audio_recorder_event(&e);
                        lVar9 = *(long *)(lVar11 + 0x20);
                        uVar1 = *(uint *)(lVar11 + 0x28);
                        local_a0 = (long)(int)uVar1;
                        uVar12 = 0;
                        uVar13 = 0;
                        if (0 < (int)uVar1) {
                          uVar13 = (ulong)uVar1;
                        }
                        iVar4 = 0;
                        for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
                          iVar14 = *(byte *)(lVar9 + uVar12) - 0x80;
                          iVar15 = -iVar14;
                          if (0 < iVar14) {
                            iVar15 = iVar14;
                          }
                          if (iVar4 <= iVar15) {
                            iVar4 = iVar15;
                          }
                        }
                        iVar15 = (int)uVar1 / 0x140;
                        al_map_rgb(0,0,0);
                        al_clear_to_color();
                        if (bVar2) {
                          if ((local_a8 != 0) && (iVar14 = (int)local_b0, iVar14 < 0x1430)) {
                            al_fwrite(local_a8,lVar9,local_a0);
                            local_b0 = (ulong)(iVar14 + 1);
                          }
                          iVar16 = 0;
                          iVar14 = 0;
                          while (lVar7 = local_88, iVar14 != 0x140) {
                            lVar7 = (long)iVar16;
                            iVar5 = (iVar14 + 1) * iVar15;
                            if ((int)local_a0 <= iVar5) {
                              iVar5 = (int)local_a0;
                            }
                            iVar6 = 0;
                            for (; lVar7 < iVar5; lVar7 = lVar7 + 1) {
                              iVar6 = iVar6 + (uint)*(byte *)(lVar9 + lVar7) + -0x80;
                            }
                            uVar18 = 0x43800000;
                            local_94 = ((float)(local_cc + 0x80) / 255.0) * 256.0 + 128.0 + -128.0;
                            local_98 = ((float)(iVar6 / iVar15 + 0x80) / 255.0) * 256.0 + 128.0 +
                                       -128.0;
                            uVar17 = al_map_rgb(0xff,0xff,0xff);
                            in_XMM1_Da = local_94;
                            al_draw_line((float)(iVar14 + -1),local_94,(float)iVar14,local_98,uVar17
                                         ,uVar18,0x3f99999a);
                            iVar16 = iVar16 + iVar15;
                            local_cc = iVar6 / iVar15;
                            iVar14 = iVar14 + 1;
                          }
                        }
                        uVar17 = al_map_rgba(0,0xff,0,0x80);
                        fVar19 = 251.0;
                        al_draw_filled_rectangle
                                  (((float)iVar4 / 127.0) * 320.0,0x437b0000,0,0x43800000,uVar17,
                                   in_XMM1_Da);
                        al_flip_display();
                        lVar9 = local_a8;
                        uVar8 = local_80;
                        in_XMM1_Da = fVar19;
                      }
                      else if (e.type == 0x2a) {
LAB_00102b0f:
                        al_destroy_audio_recorder(local_90);
                        al_destroy_audio_stream(lVar7);
                        if (lVar9 != 0) {
                          al_fclose(lVar9);
                        }
                        if (tmp_path != (ALLEGRO_PATH *)0x0) {
                          uVar8 = al_path_cstr(tmp_path,0x2f);
                          al_remove_filename(uVar8);
                          al_destroy_path(tmp_path);
                        }
                        return 0;
                      }
                      goto LAB_00102703;
                    }
                    if (lVar9 == 0) goto LAB_00102a96;
                    lVar11 = al_get_audio_stream_fragment(lVar7);
                    if (lVar11 == 0) goto LAB_00102703;
                    uVar12 = 0;
                    do {
                      lVar7 = al_fread(lVar9,lVar11 + uVar12,0x1000 - uVar12);
                      uVar12 = lVar7 + uVar12;
                      if ((0xfff < uVar12) || (cVar3 = al_feof(lVar9), cVar3 != '\0')) break;
                      iVar4 = al_ferror(lVar9);
                    } while (iVar4 == 0);
                    for (; lVar7 = local_88, uVar12 < 0x1000; uVar12 = uVar12 + 1) {
                      *(undefined1 *)(lVar11 + uVar12) = 0x80;
                    }
                    al_set_audio_stream_fragment(local_88,lVar11);
                    iVar4 = al_ferror(lVar9);
                    if ((iVar4 == 0) && (cVar3 = al_feof(lVar9), cVar3 == '\0')) goto LAB_00102703;
                    al_drain_audio_stream(lVar7);
                    al_fclose(lVar9);
                  }
LAB_00102a96:
                  lVar9 = 0;
                  goto LAB_00102703;
                }
                format = "Error creating display\n";
              }
            }
          }
        }
      }
    }
  }
  abort_example(format);
  iVar4 = __cxa_atexit();
  return iVar4;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_AUDIO_RECORDER *r;
   ALLEGRO_AUDIO_STREAM *s;
   
   ALLEGRO_EVENT_QUEUE *q;
   ALLEGRO_DISPLAY *d;
   ALLEGRO_FILE *fp = NULL;
   ALLEGRO_PATH *tmp_path = NULL;
      
   int prev = 0;
   bool is_recording = false;
   
   int n = 0; /* number of samples written to disk */
   
   (void) argc;
   (void) argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   if (!al_init_primitives_addon()) {
      abort_example("Unable to initialize primitives addon");
   }
      
   if (!al_install_keyboard()) {
      abort_example("Unable to install keyboard");
   }
      
   if (!al_install_audio()) {
      abort_example("Unable to initialize audio addon");
   }
   
   if (!al_init_acodec_addon()) {
      abort_example("Unable to initialize acodec addon");
   }
   
   /* Note: increasing the number of channels will break this demo. Other
    * settings can be changed by modifying the constants at the top of the
    * file.
    */
   r = al_create_audio_recorder(1000, samples_per_fragment, frequency,
      audio_depth, ALLEGRO_CHANNEL_CONF_1);
   if (!r) {
      abort_example("Unable to create audio recorder");
   }
   
   s = al_create_audio_stream(playback_fragment_count,
      playback_samples_per_fragment, frequency, audio_depth,
      ALLEGRO_CHANNEL_CONF_1);      
   if (!s) {
      abort_example("Unable to create audio stream");
   }
      
   al_reserve_samples(0);
   al_set_audio_stream_playing(s, false);
   al_attach_audio_stream_to_mixer(s, al_get_default_mixer());
      
   q = al_create_event_queue();
   
   /* Note: the following two options are referring to pixel samples, and have
    * nothing to do with audio samples. */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 8, ALLEGRO_SUGGEST);
   
   d = al_create_display(320, 256);
   if (!d) {
      abort_example("Error creating display\n");
   }
      
   al_set_window_title(d, "SPACE to record. P to playback.");
   
   al_register_event_source(q, al_get_audio_recorder_event_source(r));
   al_register_event_source(q, al_get_audio_stream_event_source(s));
   al_register_event_source(q, al_get_display_event_source(d));
   al_register_event_source(q, al_get_keyboard_event_source());
   
   al_start_audio_recorder(r);
   
   while (true) {
      ALLEGRO_EVENT e;

      al_wait_for_event(q, &e);
       
      if (e.type == ALLEGRO_EVENT_AUDIO_RECORDER_FRAGMENT) {
         /* We received an incoming fragment from the microphone. In this
          * example, the recorder is constantly recording even when we aren't
          * saving to disk. The display is updated every time a new fragment
          * comes in, because it makes things more simple. If the fragments
          * are coming in faster than we can update the screen, then it will be
          * a problem.
          */          
         ALLEGRO_AUDIO_RECORDER_EVENT *re = al_get_audio_recorder_event(&e);
         audio_buffer_t input = (audio_buffer_t) re->buffer;
         int sample_count = re->samples; 
         const int R = sample_count / 320;
         int i, gain = 0;
         
         /* Calculate the volume, and display it regardless if we are actively
          * recording to disk. */
         for (i = 0; i < sample_count; ++i) {
            if (gain < abs(input[i] - sample_center))
               gain = abs(input[i] - sample_center);
         }
        
         al_clear_to_color(al_map_rgb(0,0,0));
        
         if (is_recording) {
            /* Save raw bytes to disk. Assumes everything is written
             * succesfully. */
            if (fp && n < frequency / (float) samples_per_fragment * 
               max_seconds_to_record) {
               al_fwrite(fp, input, sample_count * sample_size);
               ++n;
            }

            /* Draw a pathetic visualization. It draws exactly one fragment
             * per frame. This means the visualization is dependent on the 
             * various parameters. A more thorough implementation would use this
             * event to copy the new data into a circular buffer that holds a
             * few seconds of audio. The graphics routine could then always
             * draw that last second of audio, which would cause the
             * visualization to appear constant across all different settings.
             */
            for (i = 0; i < 320; ++i) {
               int j, c = 0;
               
               /* Take the average of R samples so it fits on the screen */
               for (j = i * R; j < i * R + R && j < sample_count; ++j) {
                  c += input[j] - sample_center;
               }
               c /= R;
               
               /* Draws a line from the previous sample point to the next */
               al_draw_line(i - 1, 128 + ((prev - min_sample_val) /
                  (float) sample_range) * 256 - 128, i, 128 +
                  ((c - min_sample_val) / (float) sample_range) * 256 - 128,
                  al_map_rgb(255,255,255), 1.2);
               
               prev = c;
            }
         }
         
         /* draw volume bar */
         al_draw_filled_rectangle((gain / (float) max_sample_val) * 320, 251,
            0, 256, al_map_rgba(0, 255, 0, 128));
            
         al_flip_display();
      }
      else if (e.type == ALLEGRO_EVENT_AUDIO_STREAM_FRAGMENT) {
         /* This event is received when we are playing back the audio clip.
          * See ex_saw.c for an example dedicated to playing streams.
          */
         if (fp) {
            audio_buffer_t output = al_get_audio_stream_fragment(s);
            if (output) {
               /* Fill the buffer from the data we have recorded into the file.
                * If an error occurs (or end of file) then silence out the
                * remainder of the buffer and stop the playback.
                */
               const size_t bytes_to_read =
                  playback_samples_per_fragment * sample_size;
               size_t bytes_read = 0, i;
               
               do {
                  bytes_read += al_fread(fp, (uint8_t *)output + bytes_read,
                     bytes_to_read - bytes_read);                  
               } while (bytes_read < bytes_to_read && !al_feof(fp) &&
                  !al_ferror(fp));
               
               /* silence out unused part of buffer (end of file) */
               for (i = bytes_read / sample_size;
                  i < bytes_to_read / sample_size; ++i) {
                     output[i] = sample_center;
               }
               
               al_set_audio_stream_fragment(s, output);
               
               if (al_ferror(fp) || al_feof(fp)) {
                  al_drain_audio_stream(s);
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
      }      
      else if (e.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      else if (e.type == ALLEGRO_EVENT_KEY_CHAR) {
         if (e.keyboard.unichar == 27) {
            /* pressed ESC */
            break;
         }
         else if (e.keyboard.unichar == ' ') {
            if (!is_recording) {
               /* Start the recording */
               is_recording = true;
               
               if (al_get_audio_stream_playing(s)) {
                  al_drain_audio_stream(s);
               }
               
               /* Reuse the same temp file for all recordings */
               if (!tmp_path) {
                  fp = al_make_temp_file("alrecXXX.raw", &tmp_path);
               }
               else {
                  if (fp) al_fclose(fp);
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "w");
               }
               
               n = 0;
            }
            else {
               is_recording = false;
               if (fp) {
                  al_fclose(fp);
                  fp = NULL;
               }
            }
         }
         else if (e.keyboard.unichar == 'p') {
            /* Play the previously recorded wav file */
            if (!is_recording) {
               if (tmp_path) {
                  fp = al_fopen(al_path_cstr(tmp_path, '/'), "r");
                  if (fp) {
                     al_set_audio_stream_playing(s, true);
                  }
               }
            }
         }
      }
   }
   
   /* clean up */
   al_destroy_audio_recorder(r);
   al_destroy_audio_stream(s);
      
   if (fp)
      al_fclose(fp);
      
   if (tmp_path) {
      al_remove_filename(al_path_cstr(tmp_path, '/'));
      al_destroy_path(tmp_path);
   }
   
   return 0;
}